

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressbar.cpp
# Opt level: O0

void __thiscall QtMWidgets::ProgressBar::paintEvent(ProgressBar *this,QPaintEvent *param_1)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ProgressBarPrivate *pPVar4;
  QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
  *this_00;
  double dVar5;
  QRect QVar6;
  double local_1b8;
  double local_198;
  double local_178;
  double local_158;
  int local_144;
  int local_13c;
  int local_134;
  int local_12c;
  int local_128;
  int local_124;
  int local_11c;
  int local_114;
  int local_110;
  QBrush local_d8 [8];
  undefined1 local_d0 [8];
  QRect a2;
  QRect a1;
  QVariant local_a8;
  double local_88;
  double value;
  QBrush local_78 [8];
  undefined1 local_70 [8];
  QRect baseRect;
  QRect highlightedRect;
  int height;
  int width;
  int y;
  int x;
  int offset;
  undefined1 local_30 [8];
  QRect r;
  QPainter p;
  QPaintEvent *param_1_local;
  ProgressBar *this_local;
  
  QPainter::QPainter((QPainter *)&r.x2,(QPaintDevice *)&this->field_0x10);
  pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
           ::operator->(&this->d);
  QVar6 = ProgressBarPrivate::grooveRect(pPVar4);
  r._0_8_ = QVar6._8_8_;
  local_30 = QVar6._0_8_;
  pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
           ::operator->(&this->d);
  if ((pPVar4->animate & 1U) == 0) {
    pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    iVar2 = pPVar4->value;
    pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    pPVar4->lastPaintedValue = iVar2;
    pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    iVar2 = pPVar4->value;
    pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    iVar3 = pPVar4->maximum;
    pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    iVar1 = pPVar4->minimum;
    pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    if (pPVar4->orientation == Horizontal) {
      local_110 = QRect::width((QRect *)local_30);
    }
    else {
      local_110 = QRect::height((QRect *)local_30);
    }
    local_128 = (int)(((double)iVar2 / (double)(iVar3 - iVar1)) * (double)local_110);
    pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    if ((pPVar4->orientation == Horizontal) &&
       (pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
                 ::operator->(&this->d), (pPVar4->invertedAppearance & 1U) != 0)) {
      iVar2 = QRect::x((QRect *)local_30);
      iVar3 = QRect::width((QRect *)local_30);
      local_114 = ((iVar2 + iVar3) - local_128) + -1;
    }
    else {
      local_114 = 0;
    }
    pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    if ((pPVar4->orientation == Vertical) &&
       (pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
                 ::operator->(&this->d), (pPVar4->invertedAppearance & 1U) != 0)) {
      iVar2 = QRect::y((QRect *)local_30);
      iVar3 = QRect::height((QRect *)local_30);
      local_11c = ((iVar2 + iVar3) - local_128) + -1;
    }
    else {
      local_11c = 0;
    }
    pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    local_124 = local_128;
    if (pPVar4->orientation != Horizontal) {
      pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
               ::operator->(&this->d);
      local_124 = pPVar4->grooveHeight;
    }
    pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    if (pPVar4->orientation == Horizontal) {
      pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
               ::operator->(&this->d);
      local_128 = pPVar4->grooveHeight;
    }
    QRect::QRect((QRect *)&baseRect.x2,local_114,local_11c,local_124,local_128);
    pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    if ((pPVar4->orientation == Horizontal) &&
       (pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
                 ::operator->(&this->d), (pPVar4->invertedAppearance & 1U) == 0)) {
      local_12c = local_124;
    }
    else {
      local_12c = 0;
    }
    pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    if ((pPVar4->orientation == Vertical) &&
       (pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
                 ::operator->(&this->d), (pPVar4->invertedAppearance & 1U) == 0)) {
      local_134 = local_128;
    }
    else {
      local_134 = 0;
    }
    pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    if ((pPVar4->orientation == Horizontal) &&
       (pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
                 ::operator->(&this->d), (pPVar4->invertedAppearance & 1U) != 0)) {
      local_13c = -local_124;
    }
    else {
      local_13c = 0;
    }
    pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    if ((pPVar4->orientation == Vertical) &&
       (pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
                 ::operator->(&this->d), (pPVar4->invertedAppearance & 1U) != 0)) {
      local_144 = -local_128;
    }
    else {
      local_144 = 0;
    }
    _local_70 = QRect::adjusted((QRect *)local_30,local_12c,local_134,local_13c,local_144);
    QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
    ::operator->(&this->d);
    QPainter::setPen((QColor *)&r.x2);
    pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    QBrush::QBrush(local_78,(QColor *)&pPVar4->grooveColor,SolidPattern);
    QPainter::setBrush((QBrush *)&r.x2);
    QBrush::~QBrush(local_78);
    QPainter::drawRect((QPainter *)&r.x2,(QRect *)local_70);
    QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
    ::operator->(&this->d);
    QPainter::setPen((QColor *)&r.x2);
    pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    QBrush::QBrush((QBrush *)&value,(QColor *)&pPVar4->highlightColor,SolidPattern);
    QPainter::setBrush((QBrush *)&r.x2);
    QBrush::~QBrush((QBrush *)&value);
    QPainter::drawRect((QPainter *)&r.x2,(QRect *)&baseRect.x2);
  }
  else {
    QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
    ::operator->(&this->d);
    QVariantAnimation::currentValue();
    dVar5 = (double)QVariant::toDouble((bool *)&local_a8);
    QVariant::~QVariant(&local_a8);
    local_88 = dVar5;
    QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
    ::operator->(&this->d);
    QPainter::setPen((QColor *)&r.x2);
    pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    QBrush::QBrush((QBrush *)&a1.x2,(QColor *)&pPVar4->highlightColor,SolidPattern);
    QPainter::setBrush((QBrush *)&r.x2);
    QBrush::~QBrush((QBrush *)&a1.x2);
    QPainter::drawRect((QPainter *)&r.x2,(QRect *)local_30);
    pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    if (pPVar4->orientation == Horizontal) {
      iVar2 = QRect::x((QRect *)local_30);
      iVar3 = QRect::width((QRect *)local_30);
      dVar5 = (double)iVar3 * local_88;
      pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
               ::operator->(&this->d);
      local_158 = (double)iVar2 + dVar5 / 3.0 + (double)pPVar4->grooveHeight;
    }
    else {
      iVar2 = QRect::x((QRect *)local_30);
      local_158 = (double)iVar2;
    }
    pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    if (pPVar4->orientation == Horizontal) {
      iVar2 = QRect::y((QRect *)local_30);
      local_178 = (double)iVar2;
    }
    else {
      iVar2 = QRect::y((QRect *)local_30);
      iVar3 = QRect::height((QRect *)local_30);
      dVar5 = (double)iVar3 * local_88;
      pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
               ::operator->(&this->d);
      local_178 = (double)iVar2 + dVar5 / 3.0 + (double)pPVar4->grooveHeight;
    }
    pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    iVar2 = pPVar4->grooveHeight;
    pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    QRect::QRect((QRect *)&a2.x2,(int)local_158,(int)local_178,iVar2,pPVar4->grooveHeight);
    pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    if (pPVar4->orientation == Horizontal) {
      iVar2 = QRect::x((QRect *)local_30);
      iVar3 = QRect::width((QRect *)local_30);
      dVar5 = (double)iVar3 * local_88;
      iVar3 = QRect::width((QRect *)local_30);
      local_198 = (double)iVar2 + dVar5 / 1.5 + (double)(iVar3 / 3);
    }
    else {
      iVar2 = QRect::x((QRect *)local_30);
      local_198 = (double)iVar2;
    }
    pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    if (pPVar4->orientation == Horizontal) {
      iVar2 = QRect::y((QRect *)local_30);
      local_1b8 = (double)iVar2;
    }
    else {
      iVar2 = QRect::y((QRect *)local_30);
      iVar3 = QRect::height((QRect *)local_30);
      dVar5 = (double)iVar3 * local_88;
      iVar3 = QRect::height((QRect *)local_30);
      local_1b8 = (double)iVar2 + dVar5 / 1.5 + (double)(iVar3 / 3);
    }
    this_00 = &this->d;
    pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(this_00);
    iVar2 = pPVar4->grooveHeight;
    pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(this_00);
    QRect::QRect((QRect *)local_d0,(int)local_198,(int)local_1b8,iVar2,pPVar4->grooveHeight);
    QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
    ::operator->(this_00);
    QPainter::setPen((QColor *)&r.x2);
    pPVar4 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    QBrush::QBrush(local_d8,(QColor *)&pPVar4->animationColor,SolidPattern);
    QPainter::setBrush((QBrush *)&r.x2);
    QBrush::~QBrush(local_d8);
    QPainter::drawRect((QPainter *)&r.x2,(QRect *)&a2.x2);
    QPainter::drawRect((QPainter *)&r.x2,(QRect *)local_d0);
  }
  QPainter::~QPainter((QPainter *)&r.x2);
  return;
}

Assistant:

void
ProgressBar::paintEvent( QPaintEvent * )
{
	QPainter p( this );

	const QRect r = d->grooveRect();

	if( !d->animate )
	{
		d->lastPaintedValue = d->value;

		const int offset = (qreal) d->value / (qreal) ( d->maximum - d->minimum ) *
			( d->orientation == Qt::Horizontal ? r.width() : r.height() );

		const int x = ( ( d->orientation == Qt::Horizontal && d->invertedAppearance ) ?
			r.x() + r.width() - offset - 1 : 0 );
		const int y = ( ( d->orientation == Qt::Vertical && d->invertedAppearance ) ?
			r.y() + r.height() - offset - 1 : 0 );
		const int width = ( d->orientation == Qt::Horizontal ?
			offset : d->grooveHeight );
		const int height = ( d->orientation == Qt::Horizontal ?
			d->grooveHeight : offset );

		const QRect highlightedRect( x, y, width, height );
		const QRect baseRect = r.adjusted(
			( d->orientation == Qt::Horizontal && !d->invertedAppearance ?
				  width : 0 ),
			( d->orientation == Qt::Vertical && !d->invertedAppearance ?
				  height : 0 ),
			( d->orientation == Qt::Horizontal && d->invertedAppearance ?
				  -width : 0 ),
			( d->orientation == Qt::Vertical && d->invertedAppearance ?
				  -height : 0 ) );

		p.setPen( d->grooveColor );
		p.setBrush( d->grooveColor );

		p.drawRect( baseRect );

		p.setPen( d->highlightColor );
		p.setBrush( d->highlightColor );

		p.drawRect( highlightedRect );
	}
	else
	{
		const double value = d->animation->currentValue().toDouble();

		p.setPen( d->highlightColor );
		p.setBrush( d->highlightColor );

		p.drawRect( r );

		const QRect a1(
			( d->orientation == Qt::Horizontal ?
				r.x() + r.width() * value / 3.0 + d->grooveHeight :
				r.x() ),
			( d->orientation == Qt::Horizontal ? r.y() :
				r.y() + r.height() * value / 3.0 + d->grooveHeight ),
			d->grooveHeight, d->grooveHeight );

		const QRect a2(
			( d->orientation == Qt::Horizontal ?
				r.x() + r.width() * value / 1.5 + r.width() / 3 :
				r.x() ),
			( d->orientation == Qt::Horizontal ? r.y() :
				r.y() + r.height() * value / 1.5 + r.height() / 3 ),
			d->grooveHeight, d->grooveHeight );

		p.setPen( d->animationColor );
		p.setBrush( d->animationColor );

		p.drawRect( a1 );
		p.drawRect( a2 );
	}
}